

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,RegexFlags *flags)

{
  byte bVar1;
  RegexFlags RVar2;
  bool bVar3;
  ThreadConfiguration *pTVar4;
  
  do {
    bVar1 = ECLookahead(this,0);
    if (bVar1 == 0) {
      return;
    }
    switch(bVar1 - 0x67 >> 1 | (uint)((bVar1 - 0x67 & 1) != 0) << 0x1f) {
    case 0:
      RVar2 = *flags;
      if ((RVar2 & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar2 = *flags;
      }
      RVar2 = RVar2 | GlobalRegexFlag;
      break;
    case 1:
      RVar2 = *flags;
      if ((RVar2 & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar2 = *flags;
      }
      RVar2 = RVar2 | IgnoreCaseRegexFlag;
      break;
    default:
      goto switchD_00d30bd0_caseD_2;
    case 3:
      RVar2 = *flags;
      if ((RVar2 & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar2 = *flags;
      }
      RVar2 = RVar2 | MultilineRegexFlag;
      break;
    case 6:
      pTVar4 = (this->scriptContext->config).threadConfig;
      if (pTVar4->m_ES2018RegExDotAll != true) goto LAB_00d30c70;
      RVar2 = *flags;
      if ((RVar2 & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar2 = *flags;
      }
      RVar2 = RVar2 | DotAllRegexFlag;
      break;
    case 7:
      pTVar4 = (this->scriptContext->config).threadConfig;
LAB_00d30c70:
      if (pTVar4->m_ES6Unicode != true) goto LAB_00d30c91;
      RVar2 = *flags;
      if ((RVar2 & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar2 = *flags;
      }
      RVar2 = RVar2 | UnicodeRegexFlag;
      break;
    case 9:
      pTVar4 = (this->scriptContext->config).threadConfig;
LAB_00d30c91:
      if (pTVar4->m_ES6RegExSticky != true) {
switchD_00d30bd0_caseD_2:
        bVar3 = StandardChars<char16_t>::IsWord(this->standardChars,(ushort)bVar1);
        if (!bVar3) {
          return;
        }
        Fail(this,-0x7ff5ec67);
        return;
      }
      RVar2 = *flags;
      if ((RVar2 & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar2 = *flags;
      }
      RVar2 = RVar2 | StickyRegexFlag;
    }
    *flags = RVar2;
    ECConsume(this,1);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }